

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

size_t utf8_strlen(char *s)

{
  size_t local_20;
  size_t j;
  size_t i;
  char *s_local;
  
  local_20 = 0;
  for (j = 0; s[j] != '\0'; j = j + 1) {
    if (((int)s[j] & 0xc0U) != 0x80) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

size_t utf8_strlen(const char *s)
{
	size_t i = 0, j = 0;
	while (s[i]) {
		if ((s[i] & 0xc0) != 0x80) j++;
		i++;
	}
	return j;
}